

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

int ECDSA_size(EC_KEY *eckey)

{
  uint uVar1;
  EC_GROUP *group_00;
  BIGNUM *bn;
  size_t sVar2;
  size_t group_order_size;
  EC_GROUP *group;
  EC_KEY *key_local;
  
  if (eckey == (EC_KEY *)0x0) {
    key_local._0_4_ = 0;
  }
  else {
    group_00 = (EC_GROUP *)EC_KEY_get0_group(eckey);
    if (group_00 == (EC_GROUP *)0x0) {
      key_local._0_4_ = 0;
    }
    else {
      bn = EC_GROUP_get0_order(group_00);
      uVar1 = BN_num_bytes(bn);
      sVar2 = ECDSA_SIG_max_len((ulong)uVar1);
      key_local._0_4_ = (int)sVar2;
    }
  }
  return (int)key_local;
}

Assistant:

size_t ECDSA_size(const EC_KEY *key) {
  if (key == NULL) {
    return 0;
  }

  const EC_GROUP *group = EC_KEY_get0_group(key);
  if (group == NULL) {
    return 0;
  }

  size_t group_order_size = BN_num_bytes(EC_GROUP_get0_order(group));
  return ECDSA_SIG_max_len(group_order_size);
}